

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_NMTOKENS(void)

{
  byte bVar1;
  int iVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_4e8;
  StrX local_4d8;
  StrX local_4c8;
  long local_4b8;
  XMLCh *actRetCanRep_5;
  undefined1 local_4a8 [4];
  Status myStatus_17;
  StrX local_498;
  StrX local_488;
  long local_478;
  XMLCh *actRetCanRep_4;
  undefined1 local_468 [4];
  Status myStatus_16;
  StrX local_458;
  StrX local_448;
  long local_438;
  XMLCh *actRetCanRep_3;
  undefined1 local_428 [4];
  Status myStatus_15;
  StrX local_418;
  StrX local_408;
  long local_3f8;
  XMLCh *actRetCanRep_2;
  undefined1 local_3e8 [4];
  Status myStatus_14;
  StrX local_3d8;
  StrX local_3c8;
  long local_3b8;
  XMLCh *actRetCanRep_1;
  undefined1 local_3a8 [4];
  Status myStatus_13;
  StrX local_398;
  StrX local_388;
  long local_378;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_358;
  StrX local_348;
  XSValue *local_338;
  XSValue *actRetValue_5;
  undefined1 local_328 [4];
  Status myStatus_11;
  StrX local_318;
  StrX local_308;
  XSValue *local_2f8;
  XSValue *actRetValue_4;
  undefined1 local_2e8 [4];
  Status myStatus_10;
  StrX local_2d8;
  StrX local_2c8;
  XSValue *local_2b8;
  XSValue *actRetValue_3;
  undefined1 local_2a8 [4];
  Status myStatus_9;
  StrX local_298;
  StrX local_288;
  XSValue *local_278;
  XSValue *actRetValue_2;
  undefined1 local_268 [4];
  Status myStatus_8;
  StrX local_258;
  StrX local_248;
  XSValue *local_238;
  XSValue *actRetValue_1;
  undefined1 local_228 [4];
  Status myStatus_7;
  StrX local_218;
  StrX local_208;
  XSValue *local_1f8;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_1d8;
  byte local_1c5;
  Status local_1c4;
  undefined1 local_1c0 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1b0;
  byte local_19d;
  Status local_19c;
  undefined1 local_198 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_188;
  byte local_175;
  Status local_174;
  undefined1 local_170 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_160;
  byte local_14d;
  Status local_14c;
  undefined1 local_148 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_138;
  byte local_125;
  Status local_124;
  undefined1 local_120 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_100;
  byte local_ed;
  Status local_ec;
  bool actRetValid;
  Status myStatus;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_3 [5];
  char iv_2 [5];
  char iv_1 [7];
  char v_3 [12];
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char v_2 [24];
  char acStack_28 [8];
  char v_1 [19];
  bool toValidate;
  DataType dt;
  
  builtin_strncpy(acStack_28,"name1 na",8);
  builtin_strncpy(v_1,"me2 name3 ",0xb);
  builtin_strncpy(v_3 + 8,"Zeer",4);
  cStack_44 = 'o';
  cStack_43 = 'c';
  cStack_42 = 'h';
  cStack_41 = 'e';
  _iv_1 = 0x2039303020373030;
  builtin_strncpy(v_3,"123",4);
  stack0xffffffffffffffa4 = 0x6472;
  iv_2[0] = '#';
  iv_2[1] = 'b';
  iv_2[2] = 'o';
  iv_2[3] = 'a';
  builtin_strncpy(iv_3,"@com",5);
  act_v_ran_v_1.fValue._28_1_ = 0;
  act_v_ran_v_1.fValue._24_4_ = 0x6362613b;
  act_v_ran_v_1.f_datatype = dt_string;
  act_v_ran_v_1._4_4_ = 0;
  act_v_ran_v_3.f_datatype = dt_string;
  act_v_ran_v_3._4_4_ = 0;
  local_ec = st_Init;
  StrX::StrX(&local_100,acStack_28);
  pXVar4 = StrX::unicodeForm(&local_100);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_NMTOKENS,&local_ec,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_100);
  local_ed = bVar1 & 1;
  if (local_ed != 1) {
    pXVar4 = getDataTypeString(dt_NMTOKENS);
    StrX::StrX((StrX *)local_120,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_120);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169c,acStack_28,pcVar5,1);
    StrX::~StrX((StrX *)local_120);
    errSeen = true;
  }
  local_124 = st_Init;
  StrX::StrX(&local_138,v_3 + 8);
  pXVar4 = StrX::unicodeForm(&local_138);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_NMTOKENS,&local_124,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  local_125 = bVar1 & 1;
  if (local_125 != 1) {
    pXVar4 = getDataTypeString(dt_NMTOKENS);
    StrX::StrX((StrX *)local_148,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_148);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169d,v_3 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_148);
    errSeen = true;
  }
  local_14c = st_Init;
  StrX::StrX(&local_160,iv_1);
  pXVar4 = StrX::unicodeForm(&local_160);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_NMTOKENS,&local_14c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_160);
  local_14d = bVar1 & 1;
  if (local_14d != 1) {
    pXVar4 = getDataTypeString(dt_NMTOKENS);
    StrX::StrX((StrX *)local_170,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_170);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169e,iv_1,pcVar5,1);
    StrX::~StrX((StrX *)local_170);
    errSeen = true;
  }
  local_174 = st_Init;
  StrX::StrX(&local_188,iv_2);
  pXVar4 = StrX::unicodeForm(&local_188);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_NMTOKENS,&local_174,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_188);
  local_175 = bVar1 & 1;
  if (local_175 != 0) {
    pXVar4 = getDataTypeString(dt_NMTOKENS);
    StrX::StrX((StrX *)local_198,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_198);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a1,iv_2,pcVar5,0);
    StrX::~StrX((StrX *)local_198);
    errSeen = true;
  }
  local_19c = st_Init;
  StrX::StrX(&local_1b0,iv_3);
  pXVar4 = StrX::unicodeForm(&local_1b0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_NMTOKENS,&local_19c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1b0);
  local_19d = bVar1 & 1;
  if (local_19d != 0) {
    pXVar4 = getDataTypeString(dt_NMTOKENS);
    StrX::StrX((StrX *)local_1c0,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_1c0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a2,iv_3,pcVar5,0);
    StrX::~StrX((StrX *)local_1c0);
    errSeen = true;
  }
  local_1c4 = st_Init;
  StrX::StrX(&local_1d8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_1d8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_NMTOKENS,&local_1c4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1d8);
  local_1c5 = bVar1 & 1;
  if (local_1c5 != 0) {
    pXVar4 = getDataTypeString(dt_NMTOKENS);
    StrX::StrX((StrX *)&myStatus_6,pXVar4);
    pcVar5 = StrX::localForm((StrX *)&myStatus_6);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a3,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,0);
    StrX::~StrX((StrX *)&myStatus_6);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = st_Init;
    StrX::StrX(&local_208,acStack_28);
    pXVar4 = StrX::unicodeForm(&local_208);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_NMTOKENS,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_208);
    local_1f8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if ((Status)actRetValue != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_228,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_228);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString((Status)actRetValue);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16bd,acStack_28,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_228);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_218,pXVar4);
      StrX::localForm(&local_218);
      pvVar10 = (void *)0x16bd;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16bd,acStack_28);
      StrX::~StrX(&local_218);
      pXVar6 = local_1f8;
      errSeen = true;
      if (local_1f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_1f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = st_Init;
    StrX::StrX(&local_248,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_248);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_248);
    local_238 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_1._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_268,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_268);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_1._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16be,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_268);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_258,pXVar4);
      StrX::localForm(&local_258);
      pvVar10 = (void *)0x16be;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16be,v_3 + 8);
      StrX::~StrX(&local_258);
      pXVar6 = local_238;
      errSeen = true;
      if (local_238 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_238);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = st_Init;
    StrX::StrX(&local_288,iv_1);
    pXVar4 = StrX::unicodeForm(&local_288);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_288);
    local_278 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_2._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_2a8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_2a8);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_2._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16bf,iv_1,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_2a8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_298,pXVar4);
      StrX::localForm(&local_298);
      pvVar10 = (void *)0x16bf;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16bf,iv_1);
      StrX::~StrX(&local_298);
      pXVar6 = local_278;
      errSeen = true;
      if (local_278 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_278);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_2c8,iv_2);
    pXVar4 = StrX::unicodeForm(&local_2c8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2c8);
    local_2b8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_3._4_4_) {
          pXVar4 = getDataTypeString(dt_NMTOKENS);
          StrX::StrX((StrX *)local_2e8,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_2e8);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_3._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x16c3,iv_2,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_2e8);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_2d8,pXVar4);
      StrX::localForm(&local_2d8);
      pvVar10 = (void *)0x16c3;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c3,iv_2);
      StrX::~StrX(&local_2d8);
      pXVar6 = local_2b8;
      errSeen = true;
      if (local_2b8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2b8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_308,iv_3);
    pXVar4 = StrX::unicodeForm(&local_308);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_308);
    local_2f8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_4._4_4_) {
          pXVar4 = getDataTypeString(dt_NMTOKENS);
          StrX::StrX((StrX *)local_328,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_328);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_4._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x16c5,iv_3,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_328);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_318,pXVar4);
      StrX::localForm(&local_318);
      pvVar10 = (void *)0x16c5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c5,iv_3);
      StrX::~StrX(&local_318);
      pXVar6 = local_2f8;
      errSeen = true;
      if (local_2f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_348,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_348);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_348);
    local_338 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_5._4_4_) {
          pXVar4 = getDataTypeString(dt_NMTOKENS);
          StrX::StrX((StrX *)&myStatus_12,pXVar4);
          pcVar5 = StrX::localForm((StrX *)&myStatus_12);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_5._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x16c7,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)&myStatus_12);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_358,pXVar4);
      StrX::localForm(&local_358);
      pvVar10 = (void *)0x16c7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c7,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_358);
      pXVar6 = local_338;
      errSeen = true;
      if (local_338 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_338);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_388,acStack_28);
    pXVar4 = StrX::unicodeForm(&local_388);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_NMTOKENS,(Status *)&actRetCanRep,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_388);
    local_378 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_3a8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3a8);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16e4,acStack_28,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3a8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_398,pXVar4);
      StrX::localForm(&local_398);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16e4,acStack_28);
      StrX::~StrX(&local_398);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_378);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_3c8,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_3c8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3c8);
    local_3b8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_3e8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3e8);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16e5,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3e8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_3d8,pXVar4);
      StrX::localForm(&local_3d8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16e5,v_3 + 8);
      StrX::~StrX(&local_3d8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3b8);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_408,iv_1);
    pXVar4 = StrX::unicodeForm(&local_408);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_408);
    local_3f8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_428,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_428);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16e6,iv_1,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_428);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_418,pXVar4);
      StrX::localForm(&local_418);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16e6,iv_1);
      StrX::~StrX(&local_418);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3f8);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_448,iv_2);
    pXVar4 = StrX::unicodeForm(&local_448);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_448);
    local_438 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_468,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_468);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16ea,iv_2,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_468);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_458,pXVar4);
      StrX::localForm(&local_458);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16ea,iv_2);
      StrX::~StrX(&local_458);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_438);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_488,iv_3);
    pXVar4 = StrX::unicodeForm(&local_488);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_488);
    local_478 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX((StrX *)local_4a8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_4a8);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16ec,iv_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_4a8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_498,pXVar4);
      StrX::localForm(&local_498);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16ec,iv_3);
      StrX::~StrX(&local_498);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_478);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_4c8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_4c8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_NMTOKENS,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4c8);
    local_4b8 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt_NMTOKENS);
        StrX::StrX(&local_4e8,pXVar4);
        pcVar5 = StrX::localForm(&local_4e8);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16ee,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_4e8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_NMTOKENS);
      StrX::StrX(&local_4d8,pXVar4);
      StrX::localForm(&local_4d8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16ee,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_4d8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4b8);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_NMTOKENS()
{
    const XSValue::DataType dt = XSValue::dt_NMTOKENS;
    bool  toValidate = true;

    const char v_1[]="name1 name2 name3 ";
    const char v_2[]="Zeerochert total number";
    const char v_3[]="007 009 123";

    const char iv_1[]="#board";
    const char iv_2[]="@com";
    const char iv_3[]=";abc";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}